

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_number.cpp
# Opt level: O0

void __thiscall
Number_N10DefaultBase16_Test<char>::~Number_N10DefaultBase16_Test
          (Number_N10DefaultBase16_Test<char> *this)

{
  Number_N10DefaultBase16_Test<char> *this_local;
  
  ~Number_N10DefaultBase16_Test(this);
  operator_delete(this,400);
  return;
}

Assistant:

TYPED_TEST (Number, N10DefaultBase16) {
    pstore::dump::number_base::hex ();
    pstore::dump::number_long v (10, 16);
    v.write (this->out_);
    auto const & actual = this->out_.str ();
    auto const & expected = convert<TypeParam> ("0xa");
    EXPECT_EQ (expected, actual);
}